

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O3

SQRESULT sqstd_register_mathlib(HSQUIRRELVM v)

{
  SQInteger nparamscheck;
  long lVar1;
  char *s;
  
  s = "sqrt";
  lVar1 = 0x20;
  do {
    sq_pushstring(v,s,-1);
    nparamscheck = *(SQInteger *)((long)&PTR_typeinfo_001486c0 + lVar1);
    sq_newclosure(v,*(SQFUNCTION *)((long)&PTR_typeinfo_name_001486b8 + lVar1),0);
    sq_setparamscheck(v,nparamscheck,*(SQChar **)(&UNK_001486c8 + lVar1));
    sq_setnativeclosurename(v,-1,s);
    sq_newslot(v,-3,0);
    s = *(char **)((long)&mathlib_funcs[0].name + lVar1);
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x260);
  sq_pushstring(v,"RAND_MAX",-1);
  sq_pushinteger(v,0x7fffffff);
  sq_newslot(v,-3,0);
  sq_pushstring(v,"PI",-1);
  sq_pushfloat(v,3.1415927);
  sq_newslot(v,-3,0);
  return 0;
}

Assistant:

SQRESULT sqstd_register_mathlib(HSQUIRRELVM v)
{
    SQInteger i=0;
    while(mathlib_funcs[i].name!=0) {
        sq_pushstring(v,mathlib_funcs[i].name,-1);
        sq_newclosure(v,mathlib_funcs[i].f,0);
        sq_setparamscheck(v,mathlib_funcs[i].nparamscheck,mathlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,mathlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_pushstring(v,_SC("RAND_MAX"),-1);
    sq_pushinteger(v,RAND_MAX);
    sq_newslot(v,-3,SQFalse);
    sq_pushstring(v,_SC("PI"),-1);
    sq_pushfloat(v,(SQFloat)M_PI);
    sq_newslot(v,-3,SQFalse);
    return SQ_OK;
}